

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O3

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::~TPZCompElH1(TPZCompElH1<pzshape::TPZShapePrism> *this)

{
  TPZCompElH1<pzshape::TPZShapePrism> *this_00;
  
  this_00 = (TPZCompElH1<pzshape::TPZShapePrism> *)
            (&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
              super_TPZInterpolationSpace.super_TPZCompEl.field_0x0 +
            *(long *)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                super_TPZCompEl + -0x20));
  ~TPZCompElH1(this_00,&VTT);
  operator_delete(this_00,0x140);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::~TPZCompElH1() {
    TPZGeoEl *gel = this->Reference();
    if (gel) {
        TPZCompEl *cel = gel->Reference();
        if (cel == this) {
            this->RemoveSideRestraintsII(this->EDelete);
        }
        this->Reference()->ResetReference();
    }
    TPZStack<int64_t > connectlist;
    this->BuildConnectList(connectlist);
    int64_t nconnects = connectlist.size();
    for (int ic = 0; ic < nconnects; ic++) {
        if (connectlist[ic] != -1){
            this->fMesh->ConnectVec()[connectlist[ic]].DecrementElConnected();
        }
    }
}